

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForAHI(PlanningUnitMADPDiscrete *this,Index agI,Index ahI)

{
  bool bVar1;
  ActionHistoryTree *this_00;
  ActionHistory *this_01;
  size_t sVar2;
  const_reference pvVar3;
  uint in_EDX;
  PlanningUnit *in_RDI;
  Index unaff_retaddr;
  Index unaff_retaddr_00;
  PlanningUnitMADPDiscrete *in_stack_00000008;
  size_t h;
  Index t;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 uVar4;
  uint local_1c;
  Index local_4;
  
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeIndividualActionHistories
                    ((PlanningUnitMADPDiscreteParameters *)((long)&in_RDI[1]._m_agentI + 1));
  if (bVar1) {
    this_00 = GetActionHistoryTree(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    this_01 = TreeNode<ActionHistory>::GetContainedElement(this_00);
    sVar2 = History::GetLength((History *)this_01);
    local_4 = (Index)sVar2;
  }
  else {
    local_1c = 0;
    sVar2 = PlanningUnit::GetHorizon(in_RDI);
    while( true ) {
      uVar4 = false;
      if (local_1c < sVar2) {
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)in_RDI,(ulong)in_stack_ffffffffffffffc8);
        pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                           ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                            in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffffc8));
        uVar4 = *pvVar3 <= (ulong)in_EDX;
      }
      if ((bool)uVar4 == false) break;
      local_1c = local_1c + 1;
    }
    local_1c = local_1c - 1;
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForAHI(Index agI, Index ahI) const
{
    if(_m_params.GetComputeIndividualActionHistories())
        return(GetActionHistoryTree(agI, ahI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstAHIforT.at(agI).at(t) <= ahI )
        t++;

    //  _m_firstJAHIforT[t] > ahI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointActionHistoriesT[t] > ahI so ahI belongs to 
            //previous time step.
    return(t);
}